

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_4495f9::ECCurveTest_IsOnCurve_Test::TestBody(ECCurveTest_IsOnCurve_Test *this)

{
  EC_GROUP *group;
  UniquePtr<EC_POINT> UVar1;
  int iVar2;
  ParamType_conflict *pPVar3;
  EC_POINT *pEVar4;
  char *in_R9;
  AssertHelper local_60;
  AssertHelper local_58;
  UniquePtr<EC_POINT> p;
  string local_48;
  AssertionResult gtest_ar_;
  UniquePtr<EC_KEY> key;
  
  pPVar3 = testing::WithParamInterface<int>::GetParam();
  key._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<ec_key_st,_bssl::internal::Deleter,_true,_true>)
       EC_KEY_new_by_curve_name(*pPVar3);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (tuple<ec_key_st_*,_bssl::internal::Deleter>)
       key._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl !=
       (_Head_base<0UL,_ec_key_st_*,_false>)0x0;
  if ((tuple<ec_key_st_*,_bssl::internal::Deleter>)
      key._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl ==
      (_Head_base<0UL,_ec_key_st_*,_false>)0x0) {
    testing::Message::Message((Message *)&p);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_48,(internal *)&gtest_ar_,(AssertionResult *)0x55f7b2,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
               ,0x24d,local_48._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&p);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    iVar2 = EC_KEY_generate_key((EC_KEY *)
                                key._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>.
                                _M_t.super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ = iVar2 != 0;
    if (gtest_ar_.success_) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      group = (this->super_ECCurveTest).group_;
      pEVar4 = EC_KEY_get0_public_key
                         ((EC_KEY *)
                          key._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl);
      iVar2 = EC_POINT_is_on_curve((EC_GROUP *)group,pEVar4,(BN_CTX *)0x0);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar_.success_ = iVar2 != 0;
      if (!gtest_ar_.success_) {
        testing::Message::Message((Message *)&p);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_48,(internal *)&gtest_ar_,
                   (AssertionResult *)
                   "EC_POINT_is_on_curve(group(), EC_KEY_get0_public_key(key.get()), nullptr)",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                   ,0x252,local_48._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&p);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        std::__cxx11::string::~string((string *)&local_48);
        if ((__uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>)
            p._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>)0x0) {
          (**(code **)(*(long *)p._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>.
                                _M_t.super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      p._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<ec_point_st,_bssl::internal::Deleter,_true,_true>)
           EC_POINT_new((EC_GROUP *)(this->super_ECCurveTest).group_);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar_.success_ =
           (tuple<ec_point_st_*,_bssl::internal::Deleter>)
           p._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl !=
           (_Head_base<0UL,_ec_point_st_*,_false>)0x0;
      if ((tuple<ec_point_st_*,_bssl::internal::Deleter>)
          p._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl ==
          (_Head_base<0UL,_ec_point_st_*,_false>)0x0) {
        testing::Message::Message((Message *)&local_60);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_48,(internal *)&gtest_ar_,(AssertionResult *)0x4c5fec,"false","true",in_R9
                  );
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                   ,0x255,local_48._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
LAB_0029c9e8:
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        std::__cxx11::string::~string((string *)&local_48);
        if (local_60.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_60.data_ + 8))();
        }
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        UVar1._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl =
             p._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl;
        pEVar4 = EC_KEY_get0_public_key
                           ((EC_KEY *)
                            key._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl);
        iVar2 = EC_POINT_copy((EC_POINT *)
                              UVar1._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>
                              ._M_t.super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl,pEVar4);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ = iVar2 != 0;
        if (iVar2 == 0) {
          testing::Message::Message((Message *)&local_60);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_48,(internal *)&gtest_ar_,
                     (AssertionResult *)"EC_POINT_copy(p.get(), EC_KEY_get0_public_key(key.get()))",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_58,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                     ,0x256,local_48._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
          goto LAB_0029c9e8;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        *(undefined8 *)
         ((long)p._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl + 0x38) = 0;
        *(undefined8 *)
         ((long)p._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl + 0x40) = 0;
        *(undefined8 *)
         ((long)p._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl + 0x28) = 0;
        *(undefined8 *)
         ((long)p._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl + 0x30) = 0;
        *(undefined8 *)
         ((long)p._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl + 0x18) = 0;
        *(undefined8 *)
         ((long)p._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl + 0x20) = 0;
        *(undefined8 *)
         ((long)p._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl + 8) = 0;
        *(undefined8 *)
         ((long)p._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl + 0x10) = 0;
        *(undefined8 *)
         ((long)p._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl + 0x48) = 0;
        iVar2 = EC_POINT_is_on_curve
                          ((EC_GROUP *)(this->super_ECCurveTest).group_,
                           (EC_POINT *)
                           p._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl,(BN_CTX *)0x0);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ = iVar2 == 0;
        if (!gtest_ar_.success_) {
          testing::Message::Message((Message *)&local_60);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_48,(internal *)&gtest_ar_,
                     (AssertionResult *)"EC_POINT_is_on_curve(group(), p.get(), nullptr)","true",
                     "false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_58,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                     ,0x25b,local_48._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
          testing::internal::AssertHelper::~AssertHelper(&local_58);
          std::__cxx11::string::~string((string *)&local_48);
          if (local_60.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_60.data_ + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        UVar1 = p;
        pEVar4 = EC_KEY_get0_public_key
                           ((EC_KEY *)
                            key._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl);
        iVar2 = EC_POINT_copy((EC_POINT *)
                              UVar1._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>
                              ._M_t.super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl,pEVar4);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ = iVar2 != 0;
        if (iVar2 == 0) {
          testing::Message::Message((Message *)&local_60);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_48,(internal *)&gtest_ar_,
                     (AssertionResult *)"EC_POINT_copy(p.get(), EC_KEY_get0_public_key(key.get()))",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_58,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                     ,0x25e,local_48._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
          goto LAB_0029c9e8;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        *(undefined8 *)
         ((long)p._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl + 200) = 0;
        *(undefined8 *)
         ((long)p._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl + 0xd0) = 0;
        *(undefined8 *)
         ((long)p._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl + 0xb8) = 0;
        *(undefined8 *)
         ((long)p._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl + 0xc0) = 0;
        *(undefined8 *)
         ((long)p._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl + 0xa8) = 0;
        *(undefined8 *)
         ((long)p._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl + 0xb0) = 0;
        *(undefined8 *)
         ((long)p._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl + 0x98) = 0;
        *(undefined8 *)
         ((long)p._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl + 0xa0) = 0;
        *(undefined8 *)
         ((long)p._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl + 0xd8) = 0;
        iVar2 = EC_POINT_is_on_curve
                          ((EC_GROUP *)(this->super_ECCurveTest).group_,
                           (EC_POINT *)
                           p._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl,(BN_CTX *)0x0);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ = iVar2 != 0;
        if (!gtest_ar_.success_) {
          testing::Message::Message((Message *)&local_60);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_48,(internal *)&gtest_ar_,
                     (AssertionResult *)"EC_POINT_is_on_curve(group(), p.get(), nullptr)","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_58,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                     ,0x260,local_48._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
          goto LAB_0029c9e8;
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::~unique_ptr(&p);
      goto LAB_0029ca1e;
    }
    testing::Message::Message((Message *)&p);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_48,(internal *)&gtest_ar_,(AssertionResult *)"EC_KEY_generate_key(key.get())",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
               ,0x24e,local_48._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&p);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_60);
  std::__cxx11::string::~string((string *)&local_48);
  if ((__uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>)
      p._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>)0x0) {
    (**(code **)(*(long *)p._M_t.super___uniq_ptr_impl<ec_point_st,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_ec_point_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_ec_point_st_*,_false>._M_head_impl + 8))();
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
LAB_0029ca1e:
  std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::~unique_ptr(&key);
  return;
}

Assistant:

TEST_P(ECCurveTest, IsOnCurve) {
  bssl::UniquePtr<EC_KEY> key(EC_KEY_new_by_curve_name(GetParam()));
  ASSERT_TRUE(key);
  ASSERT_TRUE(EC_KEY_generate_key(key.get()));

  // The generated point is on the curve.
  EXPECT_TRUE(EC_POINT_is_on_curve(group(), EC_KEY_get0_public_key(key.get()),
                                   nullptr));

  bssl::UniquePtr<EC_POINT> p(EC_POINT_new(group()));
  ASSERT_TRUE(p);
  ASSERT_TRUE(EC_POINT_copy(p.get(), EC_KEY_get0_public_key(key.get())));

  // This should never happen outside of a bug, but |EC_POINT_is_on_curve|
  // rejects points not on the curve.
  OPENSSL_memset(&p->raw.X, 0, sizeof(p->raw.X));
  EXPECT_FALSE(EC_POINT_is_on_curve(group(), p.get(), nullptr));

  // The point at infinity is always on the curve.
  ASSERT_TRUE(EC_POINT_copy(p.get(), EC_KEY_get0_public_key(key.get())));
  OPENSSL_memset(&p->raw.Z, 0, sizeof(p->raw.Z));
  EXPECT_TRUE(EC_POINT_is_on_curve(group(), p.get(), nullptr));
}